

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::ComputeTargetOrder(cmGlobalGenerator *this,cmGeneratorTarget *gt,size_t *index)

{
  _Base_ptr p_Var1;
  mapped_type *pmVar2;
  _Rb_tree_node_base *p_Var3;
  pair<std::_Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>,_bool>
  pVar4;
  value_type value;
  cmGeneratorTarget *local_40;
  pair<const_cmGeneratorTarget_*const,_unsigned_long> local_38;
  
  local_38.second = 0;
  local_38.first = gt;
  pVar4 = std::
          _Rb_tree<cmGeneratorTarget_const*,std::pair<cmGeneratorTarget_const*const,unsigned_long>,std::_Select1st<std::pair<cmGeneratorTarget_const*const,unsigned_long>>,std::less<cmGeneratorTarget_const*>,std::allocator<std::pair<cmGeneratorTarget_const*const,unsigned_long>>>
          ::_M_emplace_unique<std::pair<cmGeneratorTarget_const*const,unsigned_long>&>
                    ((_Rb_tree<cmGeneratorTarget_const*,std::pair<cmGeneratorTarget_const*const,unsigned_long>,std::_Select1st<std::pair<cmGeneratorTarget_const*const,unsigned_long>>,std::less<cmGeneratorTarget_const*>,std::allocator<std::pair<cmGeneratorTarget_const*const,unsigned_long>>>
                      *)&this->TargetOrderIndex,&local_38);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_40 = gt;
    pmVar2 = std::
             map<const_cmGeneratorTarget_*,_cmTargetDependSet,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmTargetDependSet>_>_>
             ::operator[](&this->TargetDependencies,&local_40);
    for (p_Var3 = (pmVar2->
                  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                  )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 !=
        &(pmVar2->
         super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>)._M_t
         ._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      ComputeTargetOrder(this,*(cmGeneratorTarget **)(p_Var3 + 1),index);
    }
    p_Var1 = (_Base_ptr)*index;
    *index = (size_t)((long)&p_Var1->_M_color + 1);
    pVar4.first._M_node._M_node[1]._M_parent = p_Var1;
  }
  return;
}

Assistant:

void cmGlobalGenerator::ComputeTargetOrder(cmGeneratorTarget const* gt,
                                           size_t& index)
{
  std::map<cmGeneratorTarget const*, size_t>::value_type value(gt, 0);
  auto insertion = this->TargetOrderIndex.insert(value);
  if (!insertion.second) {
    return;
  }
  auto entry = insertion.first;

  const auto& deps = this->GetTargetDirectDepends(gt);
  for (const auto& d : deps) {
    this->ComputeTargetOrder(d, index);
  }

  entry->second = index++;
}